

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderLineStrip<ImPlot::GetterXsYs<unsigned_int>,ImPlot::TransformerLinLin>
               (GetterXsYs<unsigned_int> *getter,TransformerLinLin *transformer,ImDrawList *DrawList
               ,float line_weight,ImU32 col)

{
  float *pfVar1;
  ImVec2 IVar2;
  int iVar3;
  ImPlotPlot *pIVar4;
  undefined1 auVar5 [16];
  long lVar6;
  ImPlotContext *pIVar7;
  int iVar8;
  ImPlotContext *gp;
  ImPlotContext *pIVar9;
  int iVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_68;
  ImPlotContext *local_60;
  undefined1 local_58 [8];
  TransformerLinLin *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar4 = GImPlot->CurrentPlot;
  dVar15 = (double)DAT_0036a320;
  dVar16 = DAT_0036a320._8_8_;
  if (((pIVar4->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar8 = getter->Count;
    local_48 = iVar8 + -1;
    lVar6 = (long)((getter->Offset % iVar8 + iVar8) % iVar8) * (long)getter->Stride;
    iVar8 = transformer->YAxis;
    auVar12._4_4_ = 0;
    auVar12._0_4_ = *(uint *)((long)getter->Xs + lVar6);
    auVar12._8_4_ = *(uint *)((long)getter->Ys + lVar6);
    auVar12._12_4_ = 0;
    IVar2 = GImPlot->PixelRange[iVar8].Min;
    local_3c.x = (float)(GImPlot->Mx *
                         ((SUB168(auVar12 | _DAT_0036a320,0) - dVar15) - (pIVar4->XAxis).Range.Min)
                        + (double)IVar2.x);
    local_3c.y = (float)(GImPlot->My[iVar8] *
                         ((SUB168(auVar12 | _DAT_0036a320,8) - dVar16) -
                         pIVar4->YAxis[iVar8].Range.Min) + (double)IVar2.y);
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    local_40 = line_weight;
    RenderPrimitives<ImPlot::LineStripRenderer<ImPlot::GetterXsYs<unsigned_int>,ImPlot::TransformerLinLin>>
              ((LineStripRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::TransformerLinLin> *)
               local_58,DrawList,&pIVar4->PlotRect);
  }
  else {
    iVar8 = getter->Count;
    lVar6 = (long)((getter->Offset % iVar8 + iVar8) % iVar8) * (long)getter->Stride;
    iVar10 = transformer->YAxis;
    auVar11._4_4_ = 0;
    auVar11._0_4_ = *(uint *)((long)getter->Xs + lVar6);
    auVar11._8_4_ = *(uint *)((long)getter->Ys + lVar6);
    auVar11._12_4_ = 0;
    IVar2 = GImPlot->PixelRange[iVar10].Min;
    local_58._0_4_ =
         (undefined4)
         (GImPlot->Mx * ((SUB168(auVar11 | _DAT_0036a320,0) - dVar15) - (pIVar4->XAxis).Range.Min) +
         (double)IVar2.x);
    local_58._4_4_ =
         (undefined4)
         (GImPlot->My[iVar10] *
          ((SUB168(auVar11 | _DAT_0036a320,8) - dVar16) - pIVar4->YAxis[iVar10].Range.Min) +
         (double)IVar2.y);
    if (1 < iVar8) {
      iVar10 = 1;
      local_60 = GImPlot;
      pIVar7 = GImPlot;
      pIVar9 = GImPlot;
      do {
        lVar6 = (long)(((getter->Offset + iVar10) % iVar8 + iVar8) % iVar8) * (long)getter->Stride;
        iVar3 = transformer->YAxis;
        auVar14._4_4_ = 0;
        auVar14._0_4_ = *(uint *)((long)getter->Xs + lVar6);
        auVar14._8_4_ = *(uint *)((long)getter->Ys + lVar6);
        auVar14._12_4_ = 0;
        IVar2 = pIVar7->PixelRange[iVar3].Min;
        auVar5._8_8_ = dVar16;
        auVar5._0_8_ = dVar15;
        local_68.x = (float)(pIVar7->Mx *
                             ((SUB168(auVar14 | auVar5,0) - dVar15) -
                             (pIVar7->CurrentPlot->XAxis).Range.Min) + (double)IVar2.x);
        local_68.y = (float)(pIVar7->My[iVar3] *
                             ((SUB168(auVar14 | auVar5,8) - dVar16) -
                             pIVar7->CurrentPlot->YAxis[iVar3].Range.Min) + (double)IVar2.y);
        pIVar4 = pIVar9->CurrentPlot;
        fVar13 = (float)local_58._4_4_;
        if (local_68.y <= (float)local_58._4_4_) {
          fVar13 = local_68.y;
        }
        if ((fVar13 < (pIVar4->PlotRect).Max.y) &&
           (fVar13 = (float)(~-(uint)(local_68.y <= (float)local_58._4_4_) & (uint)local_68.y |
                            local_58._4_4_ & -(uint)(local_68.y <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar4->PlotRect).Min.y, *pfVar1 <= fVar13 && fVar13 != *pfVar1)) {
          fVar13 = (float)local_58._0_4_;
          if (local_68.x <= (float)local_58._0_4_) {
            fVar13 = local_68.x;
          }
          if ((fVar13 < (pIVar4->PlotRect).Max.x) &&
             (fVar13 = (float)(-(uint)(local_68.x <= (float)local_58._0_4_) & local_58._0_4_ |
                              ~-(uint)(local_68.x <= (float)local_58._0_4_) & (uint)local_68.x),
             (pIVar4->PlotRect).Min.x <= fVar13 && fVar13 != (pIVar4->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)local_58,&local_68,col,line_weight);
            dVar15 = 4503599627370496.0;
            dVar16 = 4503599627370496.0;
            iVar8 = getter->Count;
            pIVar7 = GImPlot;
            pIVar9 = local_60;
          }
        }
        iVar10 = iVar10 + 1;
        local_58._0_4_ = local_68.x;
        local_58._4_4_ = local_68.y;
      } while (iVar10 < iVar8);
    }
  }
  return;
}

Assistant:

inline void RenderLineStrip(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(LineStripRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}